

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

void __thiscall TagConfiguration::TagConfiguration(TagConfiguration *this,Configuration *cfg)

{
  child_tags_list_t *pcVar1;
  _Rb_tree_header *p_Var2;
  values_vector_t *pvVar3;
  vector_of_tags_t *pvVar4;
  set<QString,_std::less<QString>,_std::allocator<QString>_> *this_00;
  pointer pQVar5;
  pointer pPVar6;
  tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t> *ptVar7;
  Data *pDVar8;
  qsizetype qVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  QArrayData *pQVar12;
  TagVecOfTags *this_01;
  pointer pair;
  QString *str;
  pointer v;
  QLatin1String str_00;
  QLatin1String str_01;
  QLatin1String str_02;
  QLatin1String str_03;
  QLatin1String str_04;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  shared_ptr<TagVecOfTags> p;
  qstring_wrapper_t local_a8;
  undefined1 local_88 [16];
  qsizetype local_78;
  TagConfiguration *local_70;
  tag_scalar_t<int,_cfgfile::qstring_trait_t> *local_68;
  tag_scalar_t<QString,_cfgfile::qstring_trait_t> *local_60;
  tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *local_58;
  value_type local_50;
  tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t> *local_40;
  undefined **local_38;
  
  str_00.m_data = "cfg";
  str_00.m_size = 3;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t(&local_a8,str_00);
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_t_001218f8;
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  m_name.m_str.d.d = local_a8.m_str.d.d;
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  m_name.m_str.d.ptr = local_a8.m_str.d.ptr;
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  m_name.m_str.d.size = local_a8.m_str.d.size;
  if (&(local_a8.m_str.d.d)->super_QArrayData == (QArrayData *)0x0) {
    pQVar12 = (QArrayData *)0x0;
  }
  else {
    LOCK();
    ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar12 = &(local_a8.m_str.d.d)->super_QArrayData;
  }
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  m_is_mandatory = true;
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  m_is_defined = false;
  pcVar1 = &(this->super_tag_no_value_t<cfgfile::qstring_trait_t>).
            super_tag_t<cfgfile::qstring_trait_t>.m_child_tags;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
    m_child_tags.
    super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)
   &(this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
    m_line_number = 0xffffffff;
  *(undefined4 *)
   ((long)&(this->super_tag_no_value_t<cfgfile::qstring_trait_t>).
           super_tag_t<cfgfile::qstring_trait_t>.m_line_number + 4) = 0xffffffff;
  *(undefined4 *)
   &(this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
    m_column_number = 0xffffffff;
  *(undefined4 *)
   ((long)&(this->super_tag_no_value_t<cfgfile::qstring_trait_t>).
           super_tag_t<cfgfile::qstring_trait_t>.m_column_number + 4) = 0xffffffff;
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_t_00121bd8;
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  (this->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__TagConfiguration_00121800;
  str_01.m_data = "stringValue";
  str_01.m_size = 0xb;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t(&local_a8,str_01);
  local_60 = &this->m_stringValue;
  cfgfile::tag_t<cfgfile::qstring_trait_t>::tag_t
            (&local_60->super_tag_t<cfgfile::qstring_trait_t>,
             (tag_t<cfgfile::qstring_trait_t> *)this,&local_a8,true);
  (this->m_stringValue).super_tag_t<cfgfile::qstring_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_00121a50;
  (this->m_stringValue).m_value.d.d = (Data *)0x0;
  (this->m_stringValue).m_value.d.ptr = (char16_t *)0x0;
  *(undefined1 (*) [16])&(this->m_stringValue).m_value.d.size = (undefined1  [16])0x0;
  if (&(local_a8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  (this->m_constraintForListOfStringValues).super_constraint_t<QString>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_00121ce0;
  p_Var2 = &(this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var2->_M_header;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var2->_M_header;
  (this->m_constraintForListOfStringValues).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  str_02.m_data = "listOfStringValues";
  str_02.m_size = 0x12;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t(&local_a8,str_02);
  local_58 = &this->m_listOfStringValues;
  cfgfile::tag_t<cfgfile::qstring_trait_t>::tag_t
            (&local_58->super_tag_t<cfgfile::qstring_trait_t>,
             (tag_t<cfgfile::qstring_trait_t> *)this,&local_a8,true);
  (this->m_listOfStringValues).super_tag_t<cfgfile::qstring_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_vector_t_001219c0;
  pvVar3 = &(this->m_listOfStringValues).m_values;
  (pvVar3->super__Vector_base<QString,_std::allocator<QString>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<QString,_std::allocator<QString>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_listOfStringValues).m_values.super__Vector_base<QString,_std::allocator<QString>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  if (&(local_a8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  (this->m_constriantForIntValue).super_constraint_t<int>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_t_00121c90;
  (this->m_constriantForIntValue).m_min = 0;
  (this->m_constriantForIntValue).m_max = 100;
  local_38 = &PTR__tag_scalar_vector_t_001219c0;
  str_03.m_data = "intValue";
  str_03.m_size = 8;
  local_70 = this;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t(&local_a8,str_03);
  local_68 = &this->m_intValue;
  cfgfile::tag_t<cfgfile::qstring_trait_t>::tag_t
            (&local_68->super_tag_t<cfgfile::qstring_trait_t>,
             (tag_t<cfgfile::qstring_trait_t> *)this,&local_a8,true);
  (this->m_intValue).super_tag_t<cfgfile::qstring_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_t_00121c28;
  (this->m_intValue).m_value = 0;
  (this->m_intValue).m_constraint = (constraint_t<int> *)0x0;
  if (&(local_a8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  str_04.m_data = "vecOfTags";
  str_04.m_size = 9;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t(&local_a8,str_04);
  cfgfile::tag_t<cfgfile::qstring_trait_t>::tag_t
            (&(this->m_vecOfTags).super_tag_t<cfgfile::qstring_trait_t>,
             (tag_t<cfgfile::qstring_trait_t> *)this,&local_a8,true);
  (this->m_vecOfTags).super_tag_t<cfgfile::qstring_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_vector_of_tags_t_00121890;
  pvVar4 = &(this->m_vecOfTags).m_tags;
  (pvVar4->
  super__Vector_base<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar4->
  super__Vector_base<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_vecOfTags).m_tags.
    super__Vector_base<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_vecOfTags).m_current.super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (&(local_a8.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.m_str.d.d)->super_QArrayData,2,8);
    }
  }
  local_88 = (undefined1  [16])0x0;
  local_78 = 0;
  QVar13.m_data = (storage_type *)0x4;
  QVar13.m_size = (qsizetype)&local_a8;
  local_40 = &this->m_vecOfTags;
  QString::fromLatin1(QVar13);
  qVar9 = local_a8.m_str.d.size;
  pDVar8 = local_a8.m_str.d.d;
  uVar10 = local_88._0_8_;
  local_a8.m_str.d.d = (Data *)local_88._0_8_;
  local_88._0_8_ = pDVar8;
  local_88._0_8_ = pDVar8;
  local_a8.m_str.d.ptr = (char16_t *)local_88._8_8_;
  local_a8.m_str.d.size = local_78;
  local_78 = qVar9;
  if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar10,2,8);
    }
  }
  this_00 = &(this->m_constraintForListOfStringValues).m_list;
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_00,(QString *)local_88);
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,8);
    }
  }
  local_88 = (undefined1  [16])0x0;
  local_78 = 0;
  QVar14.m_data = (storage_type *)0x4;
  QVar14.m_size = (qsizetype)&local_a8;
  QString::fromLatin1(QVar14);
  qVar9 = local_a8.m_str.d.size;
  pDVar8 = local_a8.m_str.d.d;
  uVar10 = local_88._0_8_;
  uVar11 = local_88._8_8_;
  local_a8.m_str.d.d = (Data *)local_88._0_8_;
  local_88._8_8_ = local_a8.m_str.d.ptr;
  local_88._0_8_ = pDVar8;
  local_a8.m_str.d.ptr = (char16_t *)uVar11;
  local_a8.m_str.d.size = local_78;
  local_78 = qVar9;
  if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar10,2,8);
    }
  }
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_00,(QString *)local_88);
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,8);
    }
  }
  local_88 = (undefined1  [16])0x0;
  local_78 = 0;
  QVar15.m_data = (storage_type *)0x4;
  QVar15.m_size = (qsizetype)&local_a8;
  QString::fromLatin1(QVar15);
  qVar9 = local_a8.m_str.d.size;
  pDVar8 = local_a8.m_str.d.d;
  uVar10 = local_88._0_8_;
  uVar11 = local_88._8_8_;
  local_a8.m_str.d.d = (Data *)local_88._0_8_;
  local_88._8_8_ = local_a8.m_str.d.ptr;
  local_88._0_8_ = pDVar8;
  local_a8.m_str.d.ptr = (char16_t *)uVar11;
  local_a8.m_str.d.size = local_78;
  local_78 = qVar9;
  if ((TagVecOfTags *)uVar10 != (TagVecOfTags *)0x0) {
    LOCK();
    *(int *)&(((tag_no_value_t<cfgfile::qstring_trait_t> *)uVar10)->
             super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t =
         *(int *)&(((tag_no_value_t<cfgfile::qstring_trait_t> *)uVar10)->
                  super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t + -1;
    UNLOCK();
    if (*(int *)&(((tag_no_value_t<cfgfile::qstring_trait_t> *)uVar10)->
                 super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t == 0) {
      QArrayData::deallocate((QArrayData *)uVar10,2,8);
    }
  }
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_00,(QString *)local_88);
  if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,8);
    }
  }
  (this->m_listOfStringValues).m_constraint =
       &(this->m_constraintForListOfStringValues).super_constraint_t<QString>;
  (this->m_intValue).m_constraint = &(this->m_constriantForIntValue).super_constraint_t<int>;
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::set_value(local_60,&cfg->m_stringValue);
  pQVar5 = (cfg->m_listOfStringValues).super__Vector_base<QString,_std::allocator<QString>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (v = (cfg->m_listOfStringValues).super__Vector_base<QString,_std::allocator<QString>_>._M_impl
           .super__Vector_impl_data._M_start; v != pQVar5; v = v + 1) {
    cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::set_value(local_58,v);
  }
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::set_value(local_68,&cfg->m_intValue);
  pair = (cfg->m_vectorOfTags).
         super__Vector_base<Configuration::Pair,_std::allocator<Configuration::Pair>_>._M_impl.
         super__Vector_impl_data._M_start;
  pPVar6 = (cfg->m_vectorOfTags).
           super__Vector_base<Configuration::Pair,_std::allocator<Configuration::Pair>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pair != pPVar6) {
    ptVar7 = &local_70->m_vecOfTags;
    do {
      this_01 = (TagVecOfTags *)operator_new(0x138);
      TagVecOfTags::TagVecOfTags(this_01,pair);
      local_a8.m_str.d.d = (Data *)this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<TagVecOfTags*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.m_str.d.ptr,this_01);
      local_50.super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_a8.m_str.d.d;
      local_50.super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.m_str.d.ptr;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.m_str.d.ptr !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_a8.m_str.d.ptr + 8) =
               *(_Atomic_word *)((long)local_a8.m_str.d.ptr + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_a8.m_str.d.ptr + 8) =
               *(_Atomic_word *)((long)local_a8.m_str.d.ptr + 8) + 1;
        }
      }
      std::vector<std::shared_ptr<TagVecOfTags>,_std::allocator<std::shared_ptr<TagVecOfTags>_>_>::
      push_back(&ptVar7->m_tags,&local_50);
      (local_70->m_vecOfTags).super_tag_t<cfgfile::qstring_trait_t>.m_is_defined = true;
      if (local_50.super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<TagVecOfTags,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.m_str.d.ptr !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.m_str.d.ptr);
      }
      pair = pair + 1;
    } while (pair != pPVar6);
  }
  (local_70->super_tag_no_value_t<cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  m_is_defined = true;
  return;
}

Assistant:

TagConfiguration::TagConfiguration( const Configuration & cfg )
	:	cfgfile::tag_no_value_t< cfgfile::qstring_trait_t >( QLatin1String( "cfg" ), true )
	,	m_stringValue( *this, QLatin1String( "stringValue" ), true )
	,	m_listOfStringValues( *this, QLatin1String( "listOfStringValues" ), true )
	,	m_constriantForIntValue( 0, 100 )
	,	m_intValue( *this, QLatin1String( "intValue" ), true )
	,	m_vecOfTags( *this, QLatin1String( "vecOfTags" ), true )
{
	m_constraintForListOfStringValues.add_value( QLatin1String( "str1" ) );
	m_constraintForListOfStringValues.add_value( QLatin1String( "str2" ) );
	m_constraintForListOfStringValues.add_value( QLatin1String( "str3" ) );

	m_listOfStringValues.set_constraint( &m_constraintForListOfStringValues );
	m_intValue.set_constraint( &m_constriantForIntValue );

	m_stringValue.set_value( cfg.m_stringValue );

	for( const auto & str : cfg.m_listOfStringValues )
		m_listOfStringValues.set_value( str );

	m_intValue.set_value( cfg.m_intValue );

	for( const auto & pair : cfg.m_vectorOfTags )
	{
		std::shared_ptr< TagVecOfTags > p( new TagVecOfTags( pair ) );
		m_vecOfTags.set_value( p );
	}

	set_defined();
}